

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

int AF_DBlockThingsIterator_Next
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  int iVar3;
  undefined8 uVar4;
  PClass *pPVar5;
  char *__assertion;
  bool bVar6;
  
  pPVar2 = DBlockThingsIterator::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar1 != (undefined8 *)0x0) {
        if (puVar1[1] == 0) {
          uVar4 = (**(code **)*puVar1)(puVar1);
          puVar1[1] = uVar4;
        }
        pPVar5 = (PClass *)puVar1[1];
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar2 && bVar6) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar6 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar2) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar6) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DBlockThingsIterator))";
          goto LAB_0041cf02;
        }
      }
      bVar6 = FMultiBlockThingsIterator::Next
                        ((FMultiBlockThingsIterator *)(puVar1 + 5),(CheckResult *)(puVar1 + 0x3e));
      if (numret < 1) {
        iVar3 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x4cd,
                        "int AF_DBlockThingsIterator_Next(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (ret->RegType != '\0') {
          __assert_fail("RegType == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x13f,"void VMReturn::SetInt(int)");
        }
        *(uint *)ret->Location = (uint)bVar6;
        iVar3 = 1;
      }
      return iVar3;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0041cf02:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x4cc,
                "int AF_DBlockThingsIterator_Next(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DBlockThingsIterator, Next)
{
	PARAM_SELF_PROLOGUE(DBlockThingsIterator);
	ACTION_RETURN_BOOL(self->Next());
}